

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LicenseLocator_test.cpp
# Opt level: O2

void __thiscall
test::external_definition_not_found::test_method(external_definition_not_found *this)

{
  bool bVar1;
  AuditEvent *pAVar2;
  long local_11f0 [2];
  shared_count sStack_11e0;
  undefined4 local_11d4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  licenseInfos;
  string applicationDefinedString;
  undefined **local_1198;
  undefined1 local_1190;
  undefined1 *local_1188;
  char *local_1180;
  EventRegistry registry;
  ExternalDefinition externalDefinition;
  char *local_10d8;
  char *local_10d0;
  char *local_10c8;
  char *local_10c0;
  undefined1 *local_10b8;
  undefined1 *local_10b0;
  char *local_10a8;
  char *local_10a0;
  char *local_1098;
  char *local_1090;
  undefined1 *local_1088;
  undefined1 *local_1080;
  char *local_1078;
  char *local_1070;
  char *local_1068;
  char *local_1060;
  undefined1 *local_1058;
  undefined1 *local_1050;
  char *local_1048;
  char *local_1040;
  LicenseLocation licLocation;
  
  std::__cxx11::string::string
            ((string *)&applicationDefinedString,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/this/file/doesnt/exist"
             ,(allocator *)&licLocation);
  license::EventRegistry::EventRegistry(&registry);
  memset(&licLocation,0,0x1004);
  if (applicationDefinedString._M_string_length != 0) {
    memmove(licLocation.licenseData,applicationDefinedString._M_dataplus._M_p,
            applicationDefinedString._M_string_length);
  }
  license::locate::ExternalDefinition::ExternalDefinition(&externalDefinition,&licLocation);
  license::locate::ExternalDefinition::license_locations_abi_cxx11_
            (&licenseInfos,&externalDefinition,&registry);
  local_1048 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseLocator_test.cpp"
  ;
  local_1040 = "";
  local_1058 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1050 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1048,0x79);
  bVar1 = license::EventRegistry::isGood(&registry);
  local_11f0[1] = 0;
  sStack_11e0.pi_ = (sp_counted_base *)0x0;
  local_1190 = 0;
  local_1198 = &PTR__lazy_ostream_001e2290;
  local_1188 = boost::unit_test::lazy_ostream::inst;
  local_1180 = "No fatal error for now, only warnings";
  local_1068 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseLocator_test.cpp"
  ;
  local_1060 = "";
  local_11f0[0]._0_1_ = bVar1;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_11e0);
  license::EventRegistry::turnWarningsIntoErrors(&registry);
  local_1078 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseLocator_test.cpp"
  ;
  local_1070 = "";
  local_1088 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1080 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1078,0x7b);
  bVar1 = license::EventRegistry::isGood(&registry);
  local_11f0[0] = CONCAT71(local_11f0[0]._1_7_,!bVar1);
  local_11f0[1] = 0;
  sStack_11e0.pi_ = (sp_counted_base *)0x0;
  local_1190 = 0;
  local_1198 = &PTR__lazy_ostream_001e22d0;
  local_1188 = boost::unit_test::lazy_ostream::inst;
  local_1180 = "Error detected";
  local_1098 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseLocator_test.cpp"
  ;
  local_1090 = "";
  boost::test_tools::tt_detail::report_assertion(local_11f0,&local_1198,&local_1098,0x7b,2,1,0);
  boost::detail::shared_count::~shared_count(&sStack_11e0);
  local_10a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseLocator_test.cpp"
  ;
  local_10a0 = "";
  local_10b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_10b0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_10a8,0x7c);
  local_1190 = 0;
  local_1198 = &PTR__lazy_ostream_001e2150;
  local_1188 = boost::unit_test::lazy_ostream::inst;
  local_1180 = "";
  local_10c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseLocator_test.cpp"
  ;
  local_10c0 = "";
  local_11d4 = 0;
  local_11f0[0] =
       (long)licenseInfos.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)licenseInfos.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 5;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,unsigned_long>
            (&local_1198,&local_10c8,0x7c,1,2,&local_11d4,"0",local_11f0,"licenseInfos.size()");
  local_10d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseLocator_test.cpp"
  ;
  local_10d0 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_10d8,0x7d);
  pAVar2 = license::EventRegistry::getLastFailure(&registry);
  local_11f0[0] = CONCAT71(local_11f0[0]._1_7_,pAVar2->event_type == LICENSE_FILE_NOT_FOUND);
  local_11f0[1] = 0;
  sStack_11e0.pi_ = (sp_counted_base *)0x0;
  local_1190 = 0;
  local_1198 = &PTR__lazy_ostream_001e22d0;
  local_1188 = boost::unit_test::lazy_ostream::inst;
  local_1180 = "Error detected";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_11e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&licenseInfos);
  license::locate::ExternalDefinition::~ExternalDefinition(&externalDefinition);
  license::EventRegistry::~EventRegistry(&registry);
  std::__cxx11::string::~string((string *)&applicationDefinedString);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(external_definition_not_found) {
	string applicationDefinedString = PROJECT_TEST_SRC_DIR "/this/file/doesnt/exist";
	license::EventRegistry registry;
	LicenseLocation licLocation = {LICENSE_PATH};
	std::copy(applicationDefinedString.begin(), applicationDefinedString.end(), licLocation.licenseData);
	ExternalDefinition externalDefinition(&licLocation);
	vector<string> licenseInfos = externalDefinition.license_locations(registry);

	BOOST_CHECK_MESSAGE(registry.isGood(), "No fatal error for now, only warnings");
	registry.turnWarningsIntoErrors();
	BOOST_REQUIRE_MESSAGE(!registry.isGood(), "Error detected");
	BOOST_CHECK_EQUAL(0, licenseInfos.size());
	BOOST_CHECK_MESSAGE(registry.getLastFailure()->event_type == LICENSE_FILE_NOT_FOUND, "Error detected");
}